

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EntityAppearance.cpp
# Opt level: O1

void __thiscall
KDIS::DATA_TYPE::EntityAppearance::Decode(EntityAppearance *this,KDataStream *stream)

{
  KException *this_00;
  KUINT16 KVar1;
  KString local_40;
  
  KVar1 = KDataStream::GetBufferSize(stream);
  if (3 < KVar1) {
    KDataStream::Read<unsigned_int>(stream,&this->m_Appearance);
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Decode","");
  KException::KException(this_00,&local_40,2);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void EntityAppearance::Decode(KDataStream &stream) noexcept(false)
{
    if( stream.GetBufferSize() < ENTITY_APPEARANCE_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    stream >> m_Appearance;
}